

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpotController.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_433838::SpotController::save_spot_metadata(SpotController *this)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  Variant local_1e8;
  Variant local_1d8;
  Variant local_1c8;
  Variant local_1b8;
  Variant local_1a8;
  allocator<char> local_191;
  string local_190;
  Attribute local_170;
  Attribute chn_attr;
  string local_160;
  Attribute local_140;
  Attribute opt_attr;
  string local_130;
  Attribute local_110;
  Attribute fmt_attr;
  string local_100;
  Attribute local_e0;
  Attribute tsm_attr;
  string local_d0;
  Attribute local_b0;
  Attribute mtr_attr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *o;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  string local_68 [8];
  string spot_opts;
  allocator<char> local_31;
  string local_30 [8];
  string spot_channels;
  SpotController *this_local;
  
  spot_channels.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_30,"regionprofile",&local_31);
  std::allocator<char>::~allocator(&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_68,"",(allocator<char> *)((long)&__range2 + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
  cali::ConfigManager::Options::enabled_options_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__begin2,&this->m_opts);
  __end2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__begin2);
  o = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&__begin2);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&o), bVar1) {
    mtr_attr.m_node =
         (Node *)__gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end2);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      std::__cxx11::string::append((char *)local_68);
    }
    std::__cxx11::string::append(local_68);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            mtr_attr.m_node,"timeseries");
    if (bVar1) {
      std::__cxx11::string::append((char *)local_30);
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end2);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&__begin2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"spot.metrics",(allocator<char> *)((long)&tsm_attr.m_node + 7));
  local_b0 = cali::CaliperMetadataDB::create_attribute
                       (&this->m_db,&local_d0,CALI_TYPE_STRING,0x200,0,(Attribute *)0x0,
                        (Variant *)0x0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&tsm_attr.m_node + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,"spot.timeseries.metrics",
             (allocator<char> *)((long)&fmt_attr.m_node + 7));
  local_e0 = cali::CaliperMetadataDB::create_attribute
                       (&this->m_db,&local_100,CALI_TYPE_STRING,0x200,0,(Attribute *)0x0,
                        (Variant *)0x0);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator((allocator<char> *)((long)&fmt_attr.m_node + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_130,"spot.format.version",
             (allocator<char> *)((long)&opt_attr.m_node + 7));
  local_110 = cali::CaliperMetadataDB::create_attribute
                        (&this->m_db,&local_130,CALI_TYPE_INT,0x200,0,(Attribute *)0x0,
                         (Variant *)0x0);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator((allocator<char> *)((long)&opt_attr.m_node + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,"spot.options",(allocator<char> *)((long)&chn_attr.m_node + 7));
  local_140 = cali::CaliperMetadataDB::create_attribute
                        (&this->m_db,&local_160,CALI_TYPE_STRING,0x200,0,(Attribute *)0x0,
                         (Variant *)0x0);
  std::__cxx11::string::~string((string *)&local_160);
  std::allocator<char>::~allocator((allocator<char> *)((long)&chn_attr.m_node + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_190,"spot.channels",&local_191);
  local_170 = cali::CaliperMetadataDB::create_attribute
                        (&this->m_db,&local_190,CALI_TYPE_STRING,0x200,0,(Attribute *)0x0,
                         (Variant *)0x0);
  std::__cxx11::string::~string((string *)&local_190);
  std::allocator<char>::~allocator(&local_191);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cali::Variant::Variant(&local_1a8,pcVar3);
  cali::CaliperMetadataDB::set_global(&this->m_db,&local_b0,&local_1a8);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cali::Variant::Variant(&local_1b8,pcVar3);
  cali::CaliperMetadataDB::set_global(&this->m_db,&local_e0,&local_1b8);
  cali::Variant::Variant(&local_1c8,2);
  cali::CaliperMetadataDB::set_global(&this->m_db,&local_110,&local_1c8);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cali::Variant::Variant(&local_1d8,pcVar3);
  cali::CaliperMetadataDB::set_global(&this->m_db,&local_140,&local_1d8);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cali::Variant::Variant(&local_1e8,pcVar3);
  cali::CaliperMetadataDB::set_global(&this->m_db,&local_170,&local_1e8);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void save_spot_metadata()
    {
        std::string spot_channels = "regionprofile";
        std::string spot_opts     = "";

        for (const auto& o : m_opts.enabled_options()) {
            if (!spot_opts.empty())
                spot_opts.append(",");
            spot_opts.append(o);
            if (o == "timeseries")
                spot_channels.append(",timeseries");
        }

        Attribute mtr_attr = m_db.create_attribute("spot.metrics", CALI_TYPE_STRING, CALI_ATTR_GLOBAL);
        Attribute tsm_attr = m_db.create_attribute("spot.timeseries.metrics", CALI_TYPE_STRING, CALI_ATTR_GLOBAL);
        Attribute fmt_attr = m_db.create_attribute("spot.format.version", CALI_TYPE_INT, CALI_ATTR_GLOBAL);
        Attribute opt_attr = m_db.create_attribute("spot.options", CALI_TYPE_STRING, CALI_ATTR_GLOBAL);
        Attribute chn_attr = m_db.create_attribute("spot.channels", CALI_TYPE_STRING, CALI_ATTR_GLOBAL);

        m_db.set_global(mtr_attr, Variant(m_spot_metrics.c_str()));
        m_db.set_global(tsm_attr, Variant(m_spot_timeseries_metrics.c_str()));
        m_db.set_global(fmt_attr, Variant(spot_format_version));
        m_db.set_global(opt_attr, Variant(spot_opts.c_str()));
        m_db.set_global(chn_attr, Variant(spot_channels.c_str()));
    }